

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_set_scale_mode(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  AOM_SCALING_MODE *pAVar2;
  AV1_PRIMARY *pAVar3;
  int iVar4;
  aom_codec_err_t aVar5;
  undefined8 *puVar6;
  AV1EncoderConfig *oxcf;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar6 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar6 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar6 + 1;
  }
  pAVar2 = (AOM_SCALING_MODE *)*puVar6;
  aVar5 = AOM_CODEC_INVALID_PARAM;
  if (pAVar2 != (AOM_SCALING_MODE *)0x0) {
    pAVar3 = ctx->ppi;
    if (pAVar3->seq_params_locked == 0) {
      oxcf = &ctx->oxcf;
    }
    else {
      oxcf = &pAVar3->cpi->oxcf;
    }
    iVar4 = av1_set_internal_size(oxcf,&pAVar3->cpi->resize_pending_params,*pAVar2,pAVar2[1]);
    if (iVar4 == 0) {
      pAVar3 = ctx->ppi;
      if (pAVar3->seq_params_locked == 0) {
        aVar5 = update_encoder_cfg(ctx);
        return aVar5;
      }
      av1_check_fpmt_config(pAVar3,&pAVar3->cpi->oxcf);
      aVar5 = AOM_CODEC_OK;
    }
  }
  return aVar5;
}

Assistant:

static aom_codec_err_t ctrl_set_scale_mode(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  aom_scaling_mode_t *const mode = va_arg(args, aom_scaling_mode_t *);

  if (mode) {
    AV1EncoderConfig *const oxcf =
        ctx->ppi->seq_params_locked ? &ctx->ppi->cpi->oxcf : &ctx->oxcf;
    const int res =
        av1_set_internal_size(oxcf, &ctx->ppi->cpi->resize_pending_params,
                              mode->h_scaling_mode, mode->v_scaling_mode);
    if (res == 0) {
      // update_encoder_cfg() is somewhat costly and this control may be called
      // multiple times, so update_encoder_cfg() is only called to ensure frame
      // and superblock sizes are updated before they're fixed by the first
      // encode call.
      if (ctx->ppi->seq_params_locked) {
        av1_check_fpmt_config(ctx->ppi, &ctx->ppi->cpi->oxcf);
        return AOM_CODEC_OK;
      }
      return update_encoder_cfg(ctx);
    }
    return AOM_CODEC_INVALID_PARAM;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}